

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworksByAliases
          (Registry *this,StringArray *aAliases,NetworkArray *aRet,StringArray *aUnresolved)

{
  size_t sVar1;
  undefined8 uVar2;
  DomainId DVar3;
  pointer pNVar4;
  pointer pNVar5;
  ErrorCode EVar6;
  Status SVar7;
  int iVar8;
  long *plVar9;
  ulong uVar10;
  size_type *psVar11;
  iterator iVar12;
  Network *pNVar13;
  string *__x;
  char *pcVar14;
  long lVar15;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  __i;
  long lVar16;
  Network *pNVar17;
  Network *pNVar18;
  iterator __first;
  NetworkArray networks;
  string aliasAsPanId;
  uint16_t pid;
  uint64_t xpid;
  Network nwk;
  NetworkArray local_128;
  string local_108;
  unsigned_short local_e2;
  undefined1 *local_e0;
  _Alloc_hider local_d8;
  undefined1 local_d0 [8];
  char local_c8 [16];
  StringArray *local_b8;
  vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
  *local_b0;
  StringArray *local_a8;
  string *local_a0;
  uint64_t local_98;
  Network local_90;
  
  local_128.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (Network *)0x0;
  local_128.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Network *)0x0;
  local_128.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = (aAliases->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (aAliases->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  SVar7 = kError;
  local_b8 = aUnresolved;
  local_b0 = (vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
              *)aRet;
  local_a8 = aAliases;
  if (local_a0 != __x) {
    do {
      SVar7 = kError;
      sVar1 = __x->_M_string_length;
      if (((sVar1 == DAT_003a3768) &&
          ((sVar1 == 0 ||
           (iVar8 = bcmp((__x->_M_dataplus)._M_p,(anonymous_namespace)::ALIAS_ALL_abi_cxx11_,sVar1),
           iVar8 == 0)))) ||
         ((sVar1 == DAT_003a3788 &&
          ((sVar1 == 0 ||
           (iVar8 = bcmp((__x->_M_dataplus)._M_p,(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_,sVar1
                        ), iVar8 == 0)))))) {
        if ((long)(local_a8->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_a8->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start != 0x20) goto LAB_00264075;
        SVar7 = GetAllNetworks(this,&local_128);
        if (SVar7 != kSuccess) goto LAB_00264075;
        sVar1 = __x->_M_string_length;
        if ((sVar1 == DAT_003a3788) &&
           ((sVar1 == 0 ||
            (iVar8 = bcmp((__x->_M_dataplus)._M_p,(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_,
                          sVar1), iVar8 == 0)))) {
          Network::Network(&local_90);
          SVar7 = GetCurrentNetwork(this,&local_90);
          if (SVar7 == kSuccess) {
            lVar16 = (long)local_128.
                           super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_128.
                           super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            lVar15 = (lVar16 >> 5) * -0x5555555555555555 >> 2;
            iVar12._M_current =
                 local_128.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            if (0 < lVar15) {
              lVar16 = lVar15 + 1;
              iVar12._M_current =
                   local_128.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2;
              do {
                if (iVar12._M_current[-2].mId.mId == local_90.mId.mId) {
                  iVar12._M_current = iVar12._M_current + -2;
                  goto LAB_00263e81;
                }
                if (iVar12._M_current[-1].mId.mId == local_90.mId.mId) {
                  iVar12._M_current = iVar12._M_current + -1;
                  goto LAB_00263e81;
                }
                if (((iVar12._M_current)->mId).mId == local_90.mId.mId) goto LAB_00263e81;
                if (iVar12._M_current[1].mId.mId == local_90.mId.mId) {
                  iVar12._M_current = iVar12._M_current + 1;
                  goto LAB_00263e81;
                }
                lVar16 = lVar16 + -1;
                iVar12._M_current = iVar12._M_current + 4;
              } while (1 < lVar16);
              lVar16 = (long)local_128.
                             super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_128.
                              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar15 * 4);
              iVar12._M_current =
                   local_128.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar15 * 4;
            }
            lVar15 = (lVar16 >> 5) * -0x5555555555555555;
            if (lVar15 == 1) {
LAB_00263e63:
              if (((iVar12._M_current)->mId).mId != local_90.mId.mId) {
                iVar12._M_current =
                     local_128.
                     super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
            else if (lVar15 == 2) {
LAB_00263e5b:
              if (((iVar12._M_current)->mId).mId != local_90.mId.mId) {
                iVar12._M_current = iVar12._M_current + 1;
                goto LAB_00263e63;
              }
            }
            else {
              if (lVar15 != 3) goto LAB_00263e90;
              if (((iVar12._M_current)->mId).mId != local_90.mId.mId) {
                iVar12._M_current = iVar12._M_current + 1;
                goto LAB_00263e5b;
              }
            }
LAB_00263e81:
            if (iVar12._M_current !=
                local_128.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ::_M_erase(&local_128,iVar12);
            }
          }
LAB_00263e90:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90.mMlp._M_dataplus._M_p != &local_90.mMlp.field_2) {
            operator_delete(local_90.mMlp._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90.mName._M_dataplus._M_p != &local_90.mName.field_2) {
            operator_delete(local_90.mName._M_dataplus._M_p);
          }
          if (SVar7 != kSuccess) goto LAB_00264075;
        }
        SVar7 = kSuccess;
      }
      else {
        if ((sVar1 == DAT_003a3748) &&
           ((sVar1 == 0 ||
            (iVar8 = bcmp((__x->_M_dataplus)._M_p,(anonymous_namespace)::ALIAS_THIS_abi_cxx11_,sVar1
                         ), iVar8 == 0)))) {
          Network::Network(&local_90);
          SVar7 = GetCurrentNetwork(this,&local_90);
          if ((SVar7 == kSuccess) && (local_90.mId.mId != 0xffffffff)) {
            std::
            vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ::push_back(&local_128,&local_90);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_b8,__x);
          }
        }
        else {
          Network::Network(&local_90);
          utils::ParseInteger<unsigned_long>((Error *)&local_e0,&local_98,__x);
          EVar6 = (ErrorCode)local_e0;
          if (local_d8._M_p != local_c8) {
            operator_delete(local_d8._M_p);
          }
          if (((EVar6 != kNone) ||
              (SVar7 = GetNetworkByXpan(this,local_98,&local_90), SVar7 != kSuccess)) &&
             (SVar7 = GetNetworkByName(this,__x,&local_90), SVar7 != kSuccess)) {
            std::__cxx11::string::substr((ulong)&local_108,(ulong)__x);
            utils::ToLower((string *)&local_e0,&local_108);
            iVar8 = std::__cxx11::string::compare((char *)&local_e0);
            if (local_e0 != local_d0) {
              operator_delete(local_e0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p);
            }
            pcVar14 = "0x";
            if (iVar8 == 0) {
              pcVar14 = "";
            }
            local_e0 = local_d0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,pcVar14,pcVar14 + (ulong)(iVar8 != 0) * 2);
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_e0,(ulong)(__x->_M_dataplus)._M_p);
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            psVar11 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_108.field_2._M_allocated_capacity = *psVar11;
              local_108.field_2._8_8_ = plVar9[3];
            }
            else {
              local_108.field_2._M_allocated_capacity = *psVar11;
              local_108._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_108._M_string_length = plVar9[1];
            *plVar9 = (long)psVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if (local_e0 != local_d0) {
              operator_delete(local_e0);
            }
            utils::ParseInteger<unsigned_short>((Error *)&local_e0,&local_e2,&local_108);
            EVar6 = (ErrorCode)local_e0;
            if (local_d8._M_p != local_c8) {
              operator_delete(local_d8._M_p);
            }
            if (EVar6 == kNone) {
              SVar7 = GetNetworkByPan(this,&local_108,&local_90);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p);
            }
            if (SVar7 != kSuccess) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_b8,__x);
              goto LAB_00263def;
            }
          }
          std::
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ::push_back(&local_128,&local_90);
          SVar7 = kSuccess;
        }
LAB_00263def:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.mMlp._M_dataplus._M_p != &local_90.mMlp.field_2) {
          operator_delete(local_90.mMlp._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.mName._M_dataplus._M_p != &local_90.mName.field_2) {
          operator_delete(local_90.mName._M_dataplus._M_p);
        }
      }
      pNVar5 = local_128.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pNVar4 = local_128.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_128.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_128.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar16 = (long)local_128.
                       super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_128.
                       super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (lVar16 >> 5) * -0x5555555555555555;
        lVar15 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>>
                  (local_128.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_128.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar16 < 0x601) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,__gnu_cxx::__ops::_Iter_comp_iter<ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>>
                    (pNVar4,pNVar5);
        }
        else {
          pNVar17 = pNVar4 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,__gnu_cxx::__ops::_Iter_comp_iter<ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>>
                    (pNVar4,pNVar17);
          for (; pNVar17 != pNVar5; pNVar17 = pNVar17 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,__gnu_cxx::__ops::_Val_comp_iter<ot::commissioner::persistent_storage::Registry::GetNetworksByAliases(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>>
                      (pNVar17);
          }
        }
      }
      pNVar4 = local_128.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar12._M_current =
           local_128.
           super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pNVar17 = local_128.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __first._M_current =
           local_128.
           super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (local_128.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_128.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pNVar13 = pNVar17;
          iVar12._M_current =
               local_128.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          __first._M_current =
               local_128.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (pNVar13 + 1 ==
              local_128.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00264018;
          pNVar17 = pNVar13 + 1;
        } while (pNVar13->mXpan != pNVar13[1].mXpan);
        pNVar17 = pNVar13 + 2;
        for (; local_128.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish = iVar12._M_current, pNVar17 != pNVar4;
            pNVar17 = pNVar17 + 1) {
          pNVar18 = pNVar13;
          if (pNVar13->mXpan != pNVar17->mXpan) {
            pNVar18 = pNVar13 + 1;
            DVar3.mId = (pNVar17->mDomainId).mId;
            pNVar13[1].mId = (NetworkId)(pNVar17->mId).mId;
            pNVar13[1].mDomainId = (DomainId)DVar3.mId;
            std::__cxx11::string::operator=((string *)&pNVar13[1].mName,(string *)&pNVar17->mName);
            uVar2 = *(undefined8 *)((long)&pNVar17->mXpan + 6);
            pNVar13[1].mXpan = pNVar17->mXpan;
            *(undefined8 *)((long)&pNVar13[1].mXpan + 6) = uVar2;
            std::__cxx11::string::operator=((string *)&pNVar13[1].mMlp,(string *)&pNVar17->mMlp);
            pNVar13[1].mCcm = pNVar17->mCcm;
          }
          pNVar13 = pNVar18;
          iVar12._M_current =
               local_128.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        __first._M_current = pNVar13 + 1;
      }
LAB_00264018:
      std::
      vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ::_M_erase(&local_128,__first,iVar12);
      __x = __x + 1;
    } while (__x != local_a0);
    std::
    vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>>
              (local_b0,*(undefined8 *)(local_b0 + 8),
               local_128.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if (local_128.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_128.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      SVar7 = kSuccess;
    }
  }
LAB_00264075:
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&local_128);
  return SVar7;
}

Assistant:

Registry::Status Registry::GetNetworksByAliases(const StringArray &aAliases,
                                                NetworkArray      &aRet,
                                                StringArray       &aUnresolved)
{
    Registry::Status status;
    NetworkArray     networks;

    if (aAliases.size() == 0)
        return Registry::Status::kError;

    for (const auto &alias : aAliases)
    {
        if (alias == ALIAS_ALL || alias == ALIAS_OTHER)
        {
            VerifyOrExit(aAliases.size() == 1,
                         status = Registry::Status::kError); // Interpreter must have taken care of this
            VerifyOrExit((status = GetAllNetworks(networks)) == Registry::Status::kSuccess);
            if (alias == ALIAS_OTHER)
            {
                Network nwkThis;
                VerifyOrExit((status = GetCurrentNetwork(nwkThis)) == Registry::Status::kSuccess);
                auto nwkIter = find_if(networks.begin(), networks.end(),
                                       [&nwkThis](const Network &el) { return nwkThis.mId.mId == el.mId.mId; });
                if (nwkIter != networks.end())
                {
                    networks.erase(nwkIter);
                }
            }
        }
        else if (alias == ALIAS_THIS)
        {
            // Get selected nwk xpan (no selected is an error)
            Network nwkThis;
            status = GetCurrentNetwork(nwkThis);
            if (status == Registry::Status::kSuccess && nwkThis.mId.mId != EMPTY_ID)
            {
                // Put nwk into networks
                networks.push_back(nwkThis);
            }
            else // failed 'this' must not break the translation flow
            {
                aUnresolved.push_back(alias);
            }
        }
        else
        {
            Network  nwk;
            uint64_t xpid;
            uint16_t pid;

            status = Registry::Status::kNotFound;
            if (utils::ParseInteger(xpid, alias) == ERROR_NONE)
            {
                status = GetNetworkByXpan(xpid, nwk);
            }

            if (status != Registry::Status::kSuccess)
            {
                status = GetNetworkByName(alias, nwk);
            }

            if (status != Registry::Status::kSuccess)
            {
                bool        hasHexPrefix = utils::ToLower(alias.substr(0, 2)) != "0x";
                std::string aliasAsPanId = std::string(hasHexPrefix ? "0x" : "") + alias;

                if (utils::ParseInteger(pid, aliasAsPanId) == ERROR_NONE)
                {
                    status = GetNetworkByPan(aliasAsPanId, nwk);
                }
            }

            if (status == Registry::Status::kSuccess)
            {
                networks.push_back(nwk);
            }
            else // aUnresolved alias must not break processing
            {
                aUnresolved.push_back(alias);
            }
        }

        // Make results unique
        std::sort(networks.begin(), networks.end(),
                  [](Network const &a, Network const &b) { return a.mXpan < b.mXpan; });
        auto last = std::unique(networks.begin(), networks.end(),
                                [](Network const &a, Network const &b) { return a.mXpan == b.mXpan; });
        networks.erase(last, networks.end());
    }

    aRet.insert(aRet.end(), networks.begin(), networks.end());
    if (networks.size() > 0)
    {
        status = Registry::Status::kSuccess;
    }
exit:
    return status;
}